

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CmdLineParser.cpp
# Opt level: O3

bool axl::sl::CmdLineParserRoot::parseSwitch
               (ArgKind argKind,StringRef *arg,String *switchName,String *value)

{
  EVP_PKEY_CTX *pEVar1;
  EVP_PKEY_CTX EVar2;
  EVP_PKEY_CTX *dst;
  BufHdr *pBVar3;
  int iVar4;
  EVP_PKEY_CTX *pEVar5;
  
  dst = (EVP_PKEY_CTX *)arg->m_p;
  pEVar1 = dst + arg->m_length;
  if (argKind == ArgKind_CharSwitch) {
    StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
              (switchName,(EVP_PKEY_CTX *)(ulong)(uint)(int)(char)*dst,(EVP_PKEY_CTX *)switchName);
    pEVar5 = dst + 1;
  }
  else {
    pEVar5 = dst;
    if (0 < (long)arg->m_length) {
      do {
        if (((char)*pEVar5 == 0x3d) || (iVar4 = isspace((int)(char)*pEVar5), iVar4 != 0)) break;
        pEVar5 = pEVar5 + 1;
      } while (pEVar5 < pEVar1);
    }
    StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy(switchName,dst,pEVar5 + -(long)dst);
  }
  if (pEVar5 < pEVar1) {
    EVar2 = *pEVar5;
    iVar4 = isspace((int)(char)EVar2);
    if (iVar4 == 0) {
      StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
                (value,pEVar5 + (EVar2 == (EVP_PKEY_CTX)0x3d),
                 pEVar1 + -(long)(pEVar5 + (EVar2 == (EVP_PKEY_CTX)0x3d)));
      return true;
    }
  }
  pBVar3 = (value->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr;
  if (pBVar3 != (BufHdr *)0x0) {
    if ((pBVar3->super_RefCount).m_refCount == 1) {
      (value->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p = (C *)(pBVar3 + 1);
      *(undefined1 *)&pBVar3[1].super_RefCount._vptr_RefCount = 0;
      (value->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = 0;
    }
    else {
      StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                (&value->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
    }
  }
  return true;
}

Assistant:

bool
CmdLineParserRoot::parseSwitch(
	ArgKind argKind,
	const sl::StringRef& arg,
	sl::String* switchName,
	sl::String* value
) {
	const char* p = arg.cp();
	const char* end = arg.getEnd();

	if (argKind == ArgKind_CharSwitch) {
		switchName->copy(*p);
		p++;
	} else {
		const char* p0 = p;
		while (p < end && *p != '=' && !isspace(*p))
			p++;

		switchName->copy(p0, p - p0);
	}

	if (p < end && !isspace(*p)) { // has value
		if (*p == '=')
			p++;

		value->copy(p, end - p);
	} else {
		value->clear();
	}

	return true;
}